

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_scroller.cpp
# Opt level: O3

void QtMWidgets::Scroller::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  QEasingCurve *pQVar1;
  undefined4 *puVar2;
  code *pcVar3;
  long lVar4;
  uint uVar5;
  QEasingCurve *other;
  int iVar6;
  undefined4 local_30;
  undefined4 local_2c;
  void *local_28;
  undefined4 *local_20;
  undefined4 *local_18;
  
  switch(_c) {
  case InvokeMetaMethod:
    switch(_id) {
    case 0:
      local_2c = *_a[1];
      local_30 = *_a[2];
      local_20 = &local_2c;
      local_18 = &local_30;
      local_28 = (void *)0x0;
      QMetaObject::activate(_o,&staticMetaObject,0,&local_28);
      break;
    case 1:
      iVar6 = 1;
      goto LAB_00151306;
    case 2:
      iVar6 = 2;
LAB_00151306:
      QMetaObject::activate(_o,&staticMetaObject,iVar6,(void **)0x0);
      return;
    case 3:
      _q_animation((Scroller *)_o,(QVariant *)_a[1]);
      return;
    case 4:
      _q_animationFinished((Scroller *)_o);
      return;
    }
    break;
  case ReadProperty:
    if ((uint)_id < 5) {
      pQVar1 = (QEasingCurve *)*_a;
      switch(_id) {
      case 0:
        uVar5 = minRecognizedVelocity((Scroller *)_o);
        break;
      case 1:
        uVar5 = maxReachedVelocity((Scroller *)_o);
        break;
      case 2:
        uVar5 = dragStartDistance((Scroller *)_o);
        break;
      case 3:
        uVar5 = scrollTime((Scroller *)_o);
        break;
      case 4:
        other = scrollingCurve((Scroller *)_o);
        QEasingCurve::operator=(pQVar1,other);
        return;
      }
      *(uint *)&pQVar1->d_ptr = uVar5;
    }
    break;
  case WriteProperty:
    if ((uint)_id < 5) {
      pQVar1 = (QEasingCurve *)*_a;
      switch(_id) {
      case 0:
        setMinRecognizedVelocity((Scroller *)_o,*(uint *)&pQVar1->d_ptr);
        return;
      case 1:
        setMaxReachedVelocity((Scroller *)_o,*(uint *)&pQVar1->d_ptr);
        return;
      case 2:
        setDragStartDistance((Scroller *)_o,*(uint *)&pQVar1->d_ptr);
        return;
      case 3:
        setScrollTime((Scroller *)_o,*(uint *)&pQVar1->d_ptr);
        return;
      case 4:
        setScrollingCurve((Scroller *)_o,pQVar1);
        return;
      }
    }
    break;
  case IndexOfMethod:
    puVar2 = (undefined4 *)*_a;
    pcVar3 = *_a[1];
    lVar4 = *(long *)((long)_a[1] + 8);
    if (pcVar3 == scroll && lVar4 == 0) {
      *puVar2 = 0;
    }
    else if (pcVar3 == aboutToStart && lVar4 == 0) {
      *puVar2 = 1;
    }
    else if (pcVar3 == finished && lVar4 == 0) {
      *puVar2 = 2;
    }
  }
  return;
}

Assistant:

void QtMWidgets::Scroller::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    if (_c == QMetaObject::InvokeMetaMethod) {
        auto *_t = static_cast<Scroller *>(_o);
        (void)_t;
        switch (_id) {
        case 0: _t->scroll((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2]))); break;
        case 1: _t->aboutToStart(); break;
        case 2: _t->finished(); break;
        case 3: _t->_q_animation((*reinterpret_cast< std::add_pointer_t<QVariant>>(_a[1]))); break;
        case 4: _t->_q_animationFinished(); break;
        default: ;
        }
    } else if (_c == QMetaObject::IndexOfMethod) {
        int *result = reinterpret_cast<int *>(_a[0]);
        {
            using _t = void (Scroller::*)(int , int );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&Scroller::scroll)) {
                *result = 0;
                return;
            }
        }
        {
            using _t = void (Scroller::*)();
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&Scroller::aboutToStart)) {
                *result = 1;
                return;
            }
        }
        {
            using _t = void (Scroller::*)();
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&Scroller::finished)) {
                *result = 2;
                return;
            }
        }
    }
#ifndef QT_NO_PROPERTIES
    else if (_c == QMetaObject::ReadProperty) {
        auto *_t = static_cast<Scroller *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast< uint*>(_v) = _t->minRecognizedVelocity(); break;
        case 1: *reinterpret_cast< uint*>(_v) = _t->maxReachedVelocity(); break;
        case 2: *reinterpret_cast< uint*>(_v) = _t->dragStartDistance(); break;
        case 3: *reinterpret_cast< uint*>(_v) = _t->scrollTime(); break;
        case 4: *reinterpret_cast< QEasingCurve*>(_v) = _t->scrollingCurve(); break;
        default: break;
        }
    } else if (_c == QMetaObject::WriteProperty) {
        auto *_t = static_cast<Scroller *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setMinRecognizedVelocity(*reinterpret_cast< uint*>(_v)); break;
        case 1: _t->setMaxReachedVelocity(*reinterpret_cast< uint*>(_v)); break;
        case 2: _t->setDragStartDistance(*reinterpret_cast< uint*>(_v)); break;
        case 3: _t->setScrollTime(*reinterpret_cast< uint*>(_v)); break;
        case 4: _t->setScrollingCurve(*reinterpret_cast< QEasingCurve*>(_v)); break;
        default: break;
        }
    } else if (_c == QMetaObject::ResetProperty) {
    } else if (_c == QMetaObject::BindableProperty) {
    }
#endif // QT_NO_PROPERTIES
}